

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor,
               ImU32 col_fill,ImU32 col_border,ImU32 col_shadow)

{
  ImFontAtlas *this;
  ImTextureID texture_id;
  float fVar1;
  bool bVar2;
  undefined8 in_XMM0_Qb;
  undefined1 auVar3 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined1 auVar4 [16];
  ImVec2 size;
  ImVec2 offset;
  ImVec2 uv [4];
  ImVec2 local_d8;
  ImU32 local_d0;
  ImU32 local_cc;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 IStack_80;
  ImVec2 IStack_78;
  ImVec2 IStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (mouse_cursor != -1) {
    uStack_c0 = in_XMM0_Qb;
    local_c8 = (undefined1  [8])pos;
    local_b8._4_4_ = in_XMM1_Db;
    local_b8._0_4_ = scale;
    local_b8._8_4_ = in_XMM1_Dc;
    local_b8._12_4_ = in_XMM1_Dd;
    this = draw_list->_Data->Font->ContainerAtlas;
    local_98.x = 0.0;
    local_98.y = 0.0;
    local_a0.x = 0.0;
    local_a0.y = 0.0;
    local_88.x = 0.0;
    local_88.y = 0.0;
    IStack_80.x = 0.0;
    IStack_80.y = 0.0;
    IStack_78.x = 0.0;
    IStack_78.y = 0.0;
    IStack_70.x = 0.0;
    IStack_70.y = 0.0;
    bVar2 = ImFontAtlas::GetMouseCursorTexData
                      (this,mouse_cursor,&local_98,&local_a0,&local_88,&IStack_78);
    if (bVar2) {
      auVar3._8_8_ = 0;
      auVar3._0_4_ = local_98.x;
      auVar3._4_4_ = local_98.y;
      _local_c8 = vsubps_avx(_local_c8,auVar3);
      local_90 = (ImVec2)vmovlps_avx(_local_c8);
      texture_id = this->TexID;
      ImDrawList::PushTextureID(draw_list,texture_id);
      auVar4._4_4_ = local_b8._0_4_;
      auVar4._0_4_ = local_b8._0_4_;
      auVar4._8_4_ = local_b8._0_4_;
      auVar4._12_4_ = local_b8._0_4_;
      auVar3 = vinsertps_avx(auVar4,ZEXT416((uint)((float)local_b8._0_4_ * 0.0)),0x10);
      local_58._0_4_ = auVar3._0_4_ + (float)local_c8._0_4_;
      local_58._4_4_ = auVar3._4_4_ + (float)local_c8._4_4_;
      local_58._8_4_ = auVar3._8_4_ + (float)uStack_c0;
      local_58._12_4_ = auVar3._12_4_ + uStack_c0._4_4_;
      local_68 = local_a0.x * (float)local_b8._0_4_;
      fStack_64 = local_a0.y * (float)local_b8._0_4_;
      fStack_60 = (float)local_b8._0_4_ * 0.0;
      fStack_5c = (float)local_b8._0_4_ * 0.0;
      local_d8 = (ImVec2)vmovlps_avx(local_58);
      local_48._0_4_ = local_58._0_4_ + local_68;
      local_48._4_4_ = local_58._4_4_ + fStack_64;
      local_48._8_4_ = local_58._8_4_ + fStack_60;
      local_48._12_4_ = local_58._12_4_ + fStack_5c;
      local_a8 = (ImVec2)vmovlps_avx(local_48);
      local_d0 = col_border;
      local_cc = col_fill;
      ImDrawList::AddImage
                (draw_list,texture_id,&local_d8,&local_a8,&IStack_78,&IStack_70,col_shadow);
      fVar1 = (float)local_b8._0_4_ + (float)local_b8._0_4_ + (float)local_c8._0_4_;
      auVar3 = vblendps_avx(ZEXT416((uint)fVar1),local_58,2);
      auVar4 = vblendps_avx(ZEXT416((uint)(fVar1 + local_68)),local_48,2);
      local_d8 = (ImVec2)vmovlps_avx(auVar3);
      local_a8 = (ImVec2)vmovlps_avx(auVar4);
      ImDrawList::AddImage
                (draw_list,texture_id,&local_d8,&local_a8,&IStack_78,&IStack_70,col_shadow);
      local_b8._0_4_ = local_68 + (float)local_c8._0_4_;
      local_b8._4_4_ = fStack_64 + (float)local_c8._4_4_;
      local_b8._8_4_ = fStack_60 + (float)uStack_c0;
      local_b8._12_4_ = fStack_5c + uStack_c0._4_4_;
      local_d8 = (ImVec2)vmovlps_avx(local_b8);
      ImDrawList::AddImage(draw_list,texture_id,&local_90,&local_d8,&IStack_78,&IStack_70,local_d0);
      local_d8 = (ImVec2)vmovlps_avx(local_b8);
      ImDrawList::AddImage(draw_list,texture_id,&local_90,&local_d8,&local_88,&IStack_80,local_cc);
      (draw_list->_TextureIdStack).Size = (draw_list->_TextureIdStack).Size + -1;
      ImDrawList::UpdateTextureID(draw_list);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor, ImU32 col_fill, ImU32 col_border, ImU32 col_shadow)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1,0)*scale, pos + ImVec2(1,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2,0)*scale, pos + ImVec2(2,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}